

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O0

void __thiscall
TEST_RunIgnoredTest_IgnoreTestWillGetRunIfOptionSpecified_Test::testBody
          (TEST_RunIgnoredTest_IgnoreTestWillGetRunIfOptionSpecified_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  undefined1 local_60 [8];
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  TEST_RunIgnoredTest_IgnoreTestWillGetRunIfOptionSpecified_Test *this_local;
  
  commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer =
       (StringBufferTestOutput *)anon_var_dwarf_66e4;
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60,2,
             (char **)&commandLineTestRunner.fakeTCOutputWhichIsReallyABuffer,
             &(this->super_TEST_GROUP_CppUTestGroupRunIgnoredTest).registry);
  CommandLineTestRunner::runAllTestsMain((CommandLineTestRunner *)local_60);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = RunIgnoredUtest::Checker;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(bVar1 & 1),"CHECK_TRUE","RunIgnoredUtest::Checker",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0x1ca,pTVar3);
  CommandLineTestRunnerWithStringBufferOutput::~CommandLineTestRunnerWithStringBufferOutput
            ((CommandLineTestRunnerWithStringBufferOutput *)local_60);
  return;
}

Assistant:

TEST(RunIgnoredTest, IgnoreTestWillGetRunIfOptionSpecified)
{
    const char* argv[] = { "tests.exe", "-ri" };

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    CHECK_TRUE( RunIgnoredUtest::Checker );
}